

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

void __thiscall
FIX::double_conversion::DoubleToStringConverter::CreateExponentialRepresentation
          (DoubleToStringConverter *this,char *decimal_digits,int length,int exponent,
          StringBuilder *result_builder)

{
  int local_38;
  char local_32 [2];
  int first_char_pos;
  undefined1 auStack_2c [2];
  char buffer [6];
  int kMaxExponentLength;
  StringBuilder *result_builder_local;
  int exponent_local;
  int length_local;
  char *decimal_digits_local;
  DoubleToStringConverter *this_local;
  
  unique0x10000194 = result_builder;
  if (length == 0) {
    __assert_fail("length != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x50,
                  "void FIX::double_conversion::DoubleToStringConverter::CreateExponentialRepresentation(const char *, int, int, StringBuilder *) const"
                 );
  }
  StringBuilder::AddCharacter(result_builder,*decimal_digits);
  if (length != 1) {
    StringBuilder::AddCharacter(stack0xffffffffffffffd8,'.');
    StringBuilder::AddSubstring(stack0xffffffffffffffd8,decimal_digits + 1,length + -1);
  }
  StringBuilder::AddCharacter(stack0xffffffffffffffd8,this->exponent_character_);
  if (exponent < 0) {
    StringBuilder::AddCharacter(stack0xffffffffffffffd8,'-');
    result_builder_local._0_4_ = -exponent;
  }
  else {
    result_builder_local._0_4_ = exponent;
    if ((this->flags_ & 1U) != 0) {
      StringBuilder::AddCharacter(stack0xffffffffffffffd8,'+');
    }
  }
  if ((int)result_builder_local == 0) {
    StringBuilder::AddCharacter(stack0xffffffffffffffd8,'0');
  }
  else {
    if (10000.0 <= (double)(int)result_builder_local) {
      __assert_fail("exponent < 1e4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,99,
                    "void FIX::double_conversion::DoubleToStringConverter::CreateExponentialRepresentation(const char *, int, int, StringBuilder *) const"
                   );
    }
    _auStack_2c = 5;
    first_char_pos._3_1_ = 0;
    local_38 = 5;
    for (; 0 < (int)result_builder_local;
        result_builder_local._0_4_ = (int)result_builder_local / 10) {
      local_38 = local_38 + -1;
      local_32[local_38] = (char)((int)result_builder_local % 10) + '0';
    }
    StringBuilder::AddSubstring(stack0xffffffffffffffd8,local_32 + local_38,5 - local_38);
  }
  return;
}

Assistant:

void DoubleToStringConverter::CreateExponentialRepresentation(
    const char* decimal_digits,
    int length,
    int exponent,
    StringBuilder* result_builder) const {
  ASSERT(length != 0);
  result_builder->AddCharacter(decimal_digits[0]);
  if (length != 1) {
    result_builder->AddCharacter('.');
    result_builder->AddSubstring(&decimal_digits[1], length-1);
  }
  result_builder->AddCharacter(exponent_character_);
  if (exponent < 0) {
    result_builder->AddCharacter('-');
    exponent = -exponent;
  } else {
    if ((flags_ & EMIT_POSITIVE_EXPONENT_SIGN) != 0) {
      result_builder->AddCharacter('+');
    }
  }
  if (exponent == 0) {
    result_builder->AddCharacter('0');
    return;
  }
  ASSERT(exponent < 1e4);
  const int kMaxExponentLength = 5;
  char buffer[kMaxExponentLength + 1];
  buffer[kMaxExponentLength] = '\0';
  int first_char_pos = kMaxExponentLength;
  while (exponent > 0) {
    buffer[--first_char_pos] = '0' + (exponent % 10);
    exponent /= 10;
  }
  result_builder->AddSubstring(&buffer[first_char_pos],
                               kMaxExponentLength - first_char_pos);
}